

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::TransitionBufferState
          (DeviceContextVkImpl *this,BufferVkImpl *BufferVk,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,bool UpdateBufferState)

{
  RESOURCE_STATE RVar1;
  pointer pMVar2;
  VkPipelineStageFlags srcAccessMask;
  VkPipelineStageFlags dstAccessMask;
  VkPipelineStageFlags SrcStages;
  VkPipelineStageFlags DstStages;
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE extraout_EDX_00;
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  ulong uVar3;
  undefined7 in_register_00000081;
  BufferDesc *Args_2;
  ulong uVar4;
  string msg;
  String local_70;
  String local_50;
  
  Args_2 = (BufferDesc *)CONCAT71(in_register_00000081,UpdateBufferState);
  State = OldState;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              (&msg,(char (*) [55])"State transitions are not allowed inside a render pass");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TransitionBufferState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xc46);
    State = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      State = extraout_EDX_00;
    }
  }
  RVar1 = (BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_State;
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    OldState = RVar1;
    if (RVar1 == RESOURCE_STATE_UNKNOWN) {
      FormatString<char[43],char_const*,char[70]>
                (&msg,(Diligent *)"Failed to transition the state of buffer \'",
                 (char (*) [43])
                 &(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  .m_Desc,(char **)
                          "\' because the buffer state is unknown and is not explicitly specified",
                 (char (*) [70])Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p == &msg.field_2) {
        return;
      }
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      return;
    }
  }
  else if (RVar1 != OldState && RVar1 != RESOURCE_STATE_UNKNOWN) {
    GetResourceStateString_abi_cxx11_(&local_70,(Diligent *)(ulong)RVar1,State);
    GetResourceStateString_abi_cxx11_(&local_50,(Diligent *)(ulong)OldState,State_00);
    Args_2 = &(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc;
    FormatString<char[11],std::__cxx11::string,char[13],char_const*,char[32],std::__cxx11::string,char[26]>
              (&msg,(Diligent *)"The state ",(char (*) [11])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6d06b0,
               (char (*) [13])Args_2,(char **)"\' does not match the old state ",
               (char (*) [32])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " specified by the barrier",(char (*) [26])msg._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (DebugMessageCallback != (undefined *)0x0) {
      Args_2 = (BufferDesc *)0x0;
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((~OldState & NewState) != RESOURCE_STATE_UNKNOWN ||
      (OldState &
      (RESOURCE_STATE_BUILD_AS_WRITE|RESOURCE_STATE_RESOLVE_DEST|RESOURCE_STATE_COPY_DEST|
       RESOURCE_STATE_UNORDERED_ACCESS|RESOURCE_STATE_RENDER_TARGET)) != RESOURCE_STATE_UNKNOWN) {
    if ((BufferVk->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
      FormatString<char[38]>(&msg,(char (*) [38])"Cannot transition suballocated buffer");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"TransitionBufferState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xc62);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if ((BufferVk->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
      DvpVerifyDynamicAllocation(this,BufferVk);
      uVar4 = (ulong)(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
      if (uVar4 == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  (&msg,(Diligent *)"Dynamic buffer \'",
                   (char (*) [17])
                   &(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    .m_Desc,(char **)"\' does not have dynamic buffer ID",(char (*) [34])Args_2);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetDynamicBufferOffset",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                   ,0x2a2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar2 = (this->m_MappedBuffers).
               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->m_MappedBuffers).
                     super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
              -0x3333333333333333;
      if ((uVar4 <= uVar3 && uVar3 - uVar4 != 0) && (pMVar2[uVar4].Allocation.AlignedOffset != 0)) {
        FormatString<char[26],char[39]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"GetDynamicBufferOffset(&BufferVk) == 0",
                   (char (*) [39])(uVar4 * 5));
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"TransitionBufferState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xc63);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
    EnsureVkCmdBuffer(this);
    srcAccessMask = ResourceStateFlagsToVkAccessFlags(OldState);
    dstAccessMask = ResourceStateFlagsToVkAccessFlags(NewState);
    SrcStages = ResourceStateFlagsToVkPipelineStageFlags(OldState);
    DstStages = ResourceStateFlagsToVkPipelineStageFlags(NewState);
    VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
              (&this->m_CommandBuffer,srcAccessMask,dstAccessMask,SrcStages,DstStages);
    if (UpdateBufferState) {
      (BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = NewState;
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionBufferState(BufferVkImpl& BufferVk, RESOURCE_STATE OldState, RESOURCE_STATE NewState, bool UpdateBufferState)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (BufferVk.IsInKnownState())
        {
            OldState = BufferVk.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of buffer '", BufferVk.GetDesc().Name, "' because the buffer state is unknown and is not explicitly specified");
            return;
        }
    }
    else
    {
        if (BufferVk.IsInKnownState() && BufferVk.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(BufferVk.GetState()), " of buffer '",
                              BufferVk.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    if (((OldState & NewState) != NewState) || AfterWrite)
    {
        DEV_CHECK_ERR(BufferVk.m_VulkanBuffer != VK_NULL_HANDLE, "Cannot transition suballocated buffer");
        VERIFY_EXPR(GetDynamicBufferOffset(&BufferVk) == 0);

        EnsureVkCmdBuffer();
        VkPipelineStageFlags OldAccessFlags = ResourceStateFlagsToVkAccessFlags(OldState);
        VkPipelineStageFlags NewAccessFlags = ResourceStateFlagsToVkAccessFlags(NewState);
        VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
        VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);
        m_CommandBuffer.MemoryBarrier(OldAccessFlags, NewAccessFlags, OldStages, NewStages);
        if (UpdateBufferState)
        {
            BufferVk.SetState(NewState);
        }
    }
}